

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O2

void ralloc_steal(void *new_ctx,void *ptr)

{
  ralloc_header *info;
  ralloc_header *parent;
  
  if (ptr != (void *)0x0) {
    info = get_header(ptr);
    if (new_ctx == (void *)0x0) {
      parent = (ralloc_header *)0x0;
    }
    else {
      parent = get_header(new_ctx);
    }
    unlink_block(info);
    add_child(parent,info);
    return;
  }
  return;
}

Assistant:

void
ralloc_steal(const void *new_ctx, void *ptr)
{
   ralloc_header *info, *parent;

   if (unlikely(ptr == NULL))
      return;

   info = get_header(ptr);
   parent = new_ctx ? get_header(new_ctx) : NULL;

   unlink_block(info);

   add_child(parent, info);
}